

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::create_hash_table(CVmObjDict *this)

{
  int iVar1;
  vm_dict_ext *pvVar2;
  CVmHashTable *pCVar3;
  CVmObjDict *in_RDI;
  CVmHashFunc *hash_func;
  CVmHashTable *new_tab;
  undefined4 in_stack_ffffffffffffff78;
  vm_obj_id_t in_stack_ffffffffffffff7c;
  CVmHashFuncComparator *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int hash_table_size;
  vmdict_TrieNode *pvVar4;
  CVmHashTable *in_stack_ffffffffffffff90;
  CVmHashTable *new_tab_00;
  CVmHashTable *in_stack_ffffffffffffffa0;
  
  hash_table_size = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  pvVar2 = get_ext(in_RDI);
  if (pvVar2->comparator_ == 0) {
    in_stack_ffffffffffffffa0 = (CVmHashTable *)operator_new(8);
    memset(in_stack_ffffffffffffffa0,0,8);
    CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)in_stack_ffffffffffffff80);
  }
  else {
    get_ext(in_RDI);
    iVar1 = CVmObjStrComp::is_strcmp_obj(0);
    if (iVar1 == 0) {
      operator_new(0x18);
      get_ext(in_RDI);
      CVmHashFuncComparator::CVmHashFuncComparator
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else {
      operator_new(0x10);
      get_ext(in_RDI);
      vm_objp(0);
      CVmHashFuncStrComp::CVmHashFuncStrComp
                ((CVmHashFuncStrComp *)in_stack_ffffffffffffff80,
                 (CVmObjStrComp *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  pCVar3 = (CVmHashTable *)operator_new(0x20);
  CVmHashTable::CVmHashTable
            (in_stack_ffffffffffffff90,hash_table_size,&in_stack_ffffffffffffff80->super_CVmHashFunc
             ,in_stack_ffffffffffffff7c);
  new_tab_00 = pCVar3;
  pvVar2 = get_ext(in_RDI);
  if (pvVar2->hashtab_ != (CVmHashTable *)0x0) {
    get_ext(in_RDI);
    CVmHashTable::move_entries_to(in_stack_ffffffffffffffa0,new_tab_00);
    pvVar2 = get_ext(in_RDI);
    in_stack_ffffffffffffff90 = pvVar2->hashtab_;
    if (in_stack_ffffffffffffff90 != (CVmHashTable *)0x0) {
      CVmHashTable::~CVmHashTable(in_stack_ffffffffffffff90);
      operator_delete(in_stack_ffffffffffffff90,0x20);
    }
  }
  pvVar2 = get_ext(in_RDI);
  if (pvVar2->trie_ != (vmdict_TrieNode *)0x0) {
    pvVar2 = get_ext(in_RDI);
    pvVar4 = pvVar2->trie_;
    if (pvVar4 != (vmdict_TrieNode *)0x0) {
      vmdict_TrieNode::~vmdict_TrieNode((vmdict_TrieNode *)in_stack_ffffffffffffff90);
      operator_delete(pvVar4,0x18);
    }
    pvVar2 = get_ext(in_RDI);
    pvVar2->trie_ = (vmdict_TrieNode *)0x0;
  }
  pvVar2 = get_ext(in_RDI);
  pvVar2->hashtab_ = pCVar3;
  return;
}

Assistant:

void CVmObjDict::create_hash_table(VMG0_)
{
    CVmHashTable *new_tab;
    CVmHashFunc *hash_func;
    
    /*
     *   Create our hash function.  If we have a comparator object, base the
     *   hash function on the comparator; use a special hash function if we
     *   specifically have a StringComparator, since we can call these
     *   directly for better efficiency.  If we have no comparator, create a
     *   generic exact string match hash function.  
     */
    if (get_ext()->comparator_ != VM_INVALID_OBJ)
    {
        /* 
         *   use our special StringComparator hash function if possible;
         *   otherwise, use a generic comparator hash function 
         */
        if (CVmObjStrComp::is_strcmp_obj(vmg_ get_ext()->comparator_))
        {
            /* create a StringComparator hash function */
            hash_func = new CVmHashFuncStrComp(
                (CVmObjStrComp *)vm_objp(vmg_ get_ext()->comparator_));
        }
        else
        {
            /* create a generic comparator hash function */
            hash_func = new CVmHashFuncComparator(
                vmg_ get_ext()->comparator_);
        }
    }